

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::swap(Forth *this)

{
  uint Value;
  uint x;
  int n;
  Forth *this_local;
  
  requireDStackDepth(this,2,"SWAP");
  Value = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  ForthStack<unsigned_int>::moveStack(&this->dStack,1,0,1);
  ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  return;
}

Assistant:

void swap() {
			REQUIRE_DSTACK_DEPTH(2, "SWAP");
			auto n = 1;
			if (n > 0) {
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}